

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_metric.h
# Opt level: O1

void __thiscall prometheus::ClientMetric::~ClientMetric(ClientMetric *this)

{
  pointer pBVar1;
  pointer pQVar2;
  
  pBVar1 = (this->histogram).bucket.
           super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar1 != (pointer)0x0) {
    operator_delete(pBVar1);
  }
  pQVar2 = (this->summary).quantile.
           super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pQVar2 != (pointer)0x0) {
    operator_delete(pQVar2);
  }
  std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>::
  ~vector(&this->label);
  return;
}

Assistant:

struct PROMETHEUS_CPP_CORE_EXPORT ClientMetric {
  // Label

  struct Label {
    std::string name;
    std::string value;

    friend bool operator<(const Label& lhs, const Label& rhs) {
      return std::tie(lhs.name, lhs.value) < std::tie(rhs.name, rhs.value);
    }

    friend bool operator==(const Label& lhs, const Label& rhs) {
      return std::tie(lhs.name, lhs.value) == std::tie(rhs.name, rhs.value);
    }
  };
  std::vector<Label> label;

  // Counter

  struct Counter {
    double value = 0.0;
  };
  Counter counter;

  // Gauge

  struct Gauge {
    double value = 0.0;
  };
  Gauge gauge;

  // Info

  struct Info {
    double value = 1.0;
  };
  Info info;

  // Summary

  struct Quantile {
    double quantile = 0.0;
    double value = 0.0;
  };

  struct Summary {
    std::uint64_t sample_count = 0;
    double sample_sum = 0.0;
    std::vector<Quantile> quantile;
  };
  Summary summary;

  // Histogram

  struct Bucket {
    std::uint64_t cumulative_count = 0;
    double upper_bound = 0.0;
  };

  struct Histogram {
    std::uint64_t sample_count = 0;
    double sample_sum = 0.0;
    std::vector<Bucket> bucket;
  };
  Histogram histogram;

  // Untyped

  struct Untyped {
    double value = 0;
  };
  Untyped untyped;

  // Timestamp

  std::int64_t timestamp_ms = 0;
}